

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prov_custom_hsm.c
# Opt level: O0

HSM_CLIENT_HANDLE prov_custom_hsm_create(void)

{
  CUSTOM_HSM_SAMPLE_INFO *hsm_info;
  HSM_CLIENT_HANDLE result;
  
  hsm_info = (CUSTOM_HSM_SAMPLE_INFO *)malloc(0x48);
  if (hsm_info == (CUSTOM_HSM_SAMPLE_INFO *)0x0) {
    printf("Failued allocating hsm info\r\n");
    hsm_info = (CUSTOM_HSM_SAMPLE_INFO *)0x0;
  }
  else {
    hsm_info->certificate =
         "-----BEGIN CERTIFICATE-----\nBASE64 Encoded certificate Here\n-----END CERTIFICATE-----";
    hsm_info->key =
         "-----BEGIN PRIVATE KEY-----\nBASE64 Encoded certificate Here\n-----END PRIVATE KEY-----";
    hsm_info->common_name = "custom-hsm-example";
    hsm_info->endorsment_key = "Endorsement key\r\n";
    hsm_info->ek_length = 0x11;
    hsm_info->storage_root_key = "Store root key\r\n";
    hsm_info->srk_len = 0x10;
    hsm_info->symm_key = "Symmetric Key value";
    hsm_info->registration_name = "Registration Name";
  }
  return hsm_info;
}

Assistant:

HSM_CLIENT_HANDLE prov_custom_hsm_create()
{
    HSM_CLIENT_HANDLE result;
    CUSTOM_HSM_SAMPLE_INFO* hsm_info = malloc(sizeof(CUSTOM_HSM_SAMPLE_INFO));
    if (hsm_info == NULL)
    {
        (void)printf("Failued allocating hsm info\r\n");
        result = NULL;
    }
    else
    {
        // TODO: initialize any variables here
        hsm_info->certificate = CERTIFICATE;
        hsm_info->key = PRIVATE_KEY;
        hsm_info->common_name = COMMON_NAME;
        hsm_info->endorsment_key = EK;
        hsm_info->ek_length = EK_LEN;
        hsm_info->storage_root_key = SRK;
        hsm_info->srk_len = SRK_LEN;
        hsm_info->symm_key = SYMMETRIC_KEY;
        hsm_info->registration_name = REGISTRATION_NAME;
        result = hsm_info;
    }
    return result;
}